

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void getTextNode(TidyDocImpl *doc,Node *node)

{
  tmbchar tVar1;
  int iVar2;
  Bool BVar3;
  uint local_24;
  uint i;
  tmbstr txtnod;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar3 = prvTidynodeIsText(node);
  if (BVar3 != no) {
    for (local_24 = node->start; local_24 < node->end; local_24 = local_24 + 1) {
      if (0x7e < (doc->access).counter) {
        return;
      }
      tVar1 = doc->lexer->lexbuf[local_24];
      iVar2 = (doc->access).counter;
      (doc->access).counter = iVar2 + 1;
      (doc->access).textNode[iVar2] = tVar1;
    }
    for (txtnod = (tmbstr)node->content; txtnod != (tmbstr)0x0; txtnod = *(tmbstr *)(txtnod + 0x10))
    {
      getTextNode(doc,(Node *)txtnod);
    }
  }
  return;
}

Assistant:

static void getTextNode( TidyDocImpl* doc, Node* node )
{
    tmbstr txtnod = doc->access.textNode;       
    
    /* 
       Continues to traverse through container element until it no
       longer contains any more contents 
    */

    /* If the tag of the node is NULL, then grab the text within the node */
    if ( TY_(nodeIsText)(node) )
    {
        uint i;

        /* Retrieves each character found within the text node */
        for (i = node->start; i < node->end; i++)
        {
            /* The text must not exceed buffer */
            if ( doc->access.counter >= TEXTBUF_SIZE-1 )
                return;

            txtnod[ doc->access.counter++ ] = doc->lexer->lexbuf[i];
        }

        /* Traverses through the contents within a container element */
        for ( node = node->content; node != NULL; node = node->next )
            getTextNode( doc, node );
    }   
}